

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# active_info.c
# Opt level: O2

double inform_active_info(int *series,size_t n,size_t m,int b,size_t k,inform_error *err)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  _Bool _Var7;
  ulong uVar8;
  ulong uVar9;
  void *__ptr;
  ulong uVar10;
  long lVar11;
  size_t sVar12;
  ulong uVar13;
  void *pvVar14;
  int iVar15;
  long lVar16;
  int iVar17;
  size_t sVar18;
  int *piVar19;
  size_t j_1;
  int future;
  ulong uVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  undefined1 auVar25 [16];
  int local_70;
  
  _Var7 = check_arguments(series,n,m,b,k,err);
  dVar21 = NAN;
  if (!_Var7) {
    auVar25._8_4_ = (int)(k >> 0x20);
    auVar25._0_8_ = k;
    auVar25._12_4_ = 0x45300000;
    dVar21 = pow((double)b,
                 (auVar25._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)k) - 4503599627370496.0));
    dVar21 = dVar21 * (double)b;
    uVar8 = (ulong)dVar21;
    uVar8 = (long)(dVar21 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f | uVar8;
    uVar10 = (ulong)b;
    uVar9 = uVar8 / uVar10;
    __ptr = calloc(uVar10 + uVar8 + uVar9,4);
    if (__ptr == (void *)0x0) {
      if (err != (inform_error *)0x0) {
        *err = INFORM_ENOMEM;
      }
      dVar21 = NAN;
    }
    else {
      lVar11 = (m - k) * n;
      lVar6 = uVar9 * 4 + uVar8 * 4;
      for (sVar12 = 0; sVar12 != n; sVar12 = sVar12 + 1) {
        iVar15 = 0;
        iVar17 = 1;
        for (sVar18 = 0; piVar19 = series, uVar13 = k, k != sVar18; sVar18 = sVar18 + 1) {
          iVar17 = iVar17 * b;
          iVar15 = iVar15 * b + series[sVar18];
        }
        for (; uVar13 < m; uVar13 = uVar13 + 1) {
          iVar2 = piVar19[k];
          lVar16 = (long)(iVar15 * b) + (long)iVar2;
          piVar1 = (int *)((long)__ptr + lVar16 * 4);
          *piVar1 = *piVar1 + 1;
          piVar1 = (int *)((long)__ptr + (long)iVar15 * 4 + uVar8 * 4);
          *piVar1 = *piVar1 + 1;
          piVar1 = (int *)((long)__ptr + (long)iVar2 * 4 + lVar6);
          *piVar1 = *piVar1 + 1;
          iVar15 = (int)lVar16 - *piVar19 * iVar17;
          piVar19 = piVar19 + 1;
        }
        series = series + m;
      }
      dVar23 = ((double)CONCAT44(0x45300000,(int)((ulong)lVar11 >> 0x20)) - 1.9342813113834067e+25)
               + ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0);
      uVar20 = 0;
      uVar13 = (ulong)(uint)b;
      if (b < 1) {
        uVar13 = uVar20;
      }
      local_70 = (int)uVar9;
      dVar21 = 0.0;
      pvVar14 = __ptr;
      for (; (long)uVar20 < (long)local_70; uVar20 = uVar20 + 1) {
        uVar3 = *(uint *)((long)__ptr + uVar20 * 4 + uVar8 * 4);
        if (uVar3 != 0) {
          for (uVar9 = 0; uVar13 != uVar9; uVar9 = uVar9 + 1) {
            uVar4 = *(uint *)((long)__ptr + uVar9 * 4 + lVar6);
            if ((uVar4 != 0) && (uVar5 = *(uint *)((long)pvVar14 + uVar9 * 4), uVar5 != 0)) {
              dVar24 = (double)uVar5;
              dVar22 = log2((dVar23 * dVar24) / ((double)uVar4 * (double)uVar3));
              dVar21 = dVar21 + dVar22 * dVar24;
            }
          }
        }
        pvVar14 = (void *)((long)pvVar14 + uVar10 * 4);
      }
      free(__ptr);
      dVar21 = dVar21 / dVar23;
    }
  }
  return dVar21;
}

Assistant:

double inform_active_info(int const *series, size_t n, size_t m, int b,
    size_t k, inform_error *err)
{
    if (check_arguments(series, n, m, b, k, err)) return NAN;

    size_t const N = n * (m - k);

    size_t const states_size = (size_t) (b * pow((double) b,(double) k));
    size_t const histories_size = states_size / b;
    size_t const futures_size = b;
    size_t const total_size = states_size + histories_size + futures_size;

    uint32_t *data = calloc(total_size, sizeof(uint32_t));
    if (data == NULL)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NAN);
    }

    inform_dist states    = { data, states_size, N };
    inform_dist histories = { data + states_size, histories_size, N };
    inform_dist futures   = { data + states_size + histories_size, futures_size, N };

    accumulate_observations(series, n, m, b, k, &states, &histories, &futures);

    double ai = 0.0;
    int state;
    double n_state, n_history, n_future;
    for (int history = 0; history < (int) histories_size; ++history)
    {
        n_history = histories.histogram[history];
        if (n_history == 0)
        {
            continue;
        }
        for (int future = 0; future < b; ++future)
        {
            n_future = futures.histogram[future];
            if (n_future == 0)
            {
                continue;
            }
            state = history * b + future;
            n_state = states.histogram[state];
            if (n_state == 0)
            {
                continue;
            }
            ai += n_state * log2((N * n_state) / (n_history * n_future));
        }
    }

    free(data);

    return ai / N;
}